

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O3

void __thiscall
kj::HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>::
erase<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Entry,unsigned_long&>
          (HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks> *this,
          ArrayPtr<kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::Entry> table,size_t pos,
          unsigned_long *params)

{
  long lVar1;
  char *pcVar2;
  size_t sVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  String SStack_28;
  
  uVar5 = *params;
  if (uVar5 >> 0x20 == 0) {
    uVar4 = (uint)uVar5 * 0x8000 + ~(uint)uVar5;
    uVar4 = (uVar4 >> 0xc ^ uVar4) * 5;
    uVar4 = (uVar4 >> 4 ^ uVar4) * 0x809;
    uVar4 = uVar4 >> 0x10 ^ uVar4;
  }
  else {
    uVar5 = uVar5 * 0x40000 + ~uVar5;
    uVar5 = (uVar5 >> 0x1f ^ uVar5) * 0x15;
    uVar5 = (uVar5 >> 0xb ^ uVar5) * 0x41;
    uVar4 = (uint)(uVar5 >> 0x16) ^ (uint)uVar5;
  }
  lVar1 = *(long *)(this + 0x10);
  uVar5 = (ulong)((int)*(ulong *)(this + 0x18) - 1U & uVar4);
  iVar6 = (int)pos + 2;
  iVar8 = *(int *)(lVar1 + 4 + uVar5 * 8);
  if (iVar6 != iVar8) {
    do {
      if (iVar8 == 0) {
        if (kj::_::Debug::minSeverity < 3) {
          getStackTrace();
          kj::_::Debug::log<char_const(&)[264],kj::String>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
                     ,0x39,ERROR,
                     "\"HashIndex detected hash table inconsistency. This can happen if you create a kj::Table \" \"with a hash index and you modify the rows in the table post-indexing in a way that would \" \"change their hash. This is a serious bug which will lead to undefined behavior.\" \"\\nstack: \", kj::getStackTrace()"
                     ,(char (*) [264])
                      "HashIndex detected hash table inconsistency. This can happen if you create a kj::Table with a hash index and you modify the rows in the table post-indexing in a way that would change their hash. This is a serious bug which will lead to undefined behavior.\nstack: "
                     ,&SStack_28);
          sVar3 = SStack_28.content.size_;
          pcVar2 = SStack_28.content.ptr;
          if (SStack_28.content.ptr != (char *)0x0) {
            SStack_28.content.ptr = (char *)0x0;
            SStack_28.content.size_ = 0;
            (**(SStack_28.content.disposer)->_vptr_ArrayDisposer)
                      (SStack_28.content.disposer,pcVar2,1,sVar3,sVar3,0);
          }
        }
        return;
      }
      uVar7 = uVar5 + 1;
      uVar5 = uVar7 & 0xffffffff;
      if (uVar7 == *(ulong *)(this + 0x18)) {
        uVar5 = 0;
      }
      iVar8 = *(int *)(lVar1 + 4 + uVar5 * 8);
    } while (iVar6 != iVar8);
  }
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(undefined4 *)(lVar1 + 4 + uVar5 * 8) = 1;
  return;
}

Assistant:

inline uint hashCode(T&& value) { return _::HASHCODER * kj::fwd<T>(value); }